

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-thread-priority.c
# Opt level: O2

int run_test_thread_priority(void)

{
  int iVar1;
  int iVar2;
  uv_thread_t uVar3;
  pthread_t tid;
  char *pcVar4;
  char *pcVar5;
  undefined8 uVar6;
  int64_t eval_b;
  int64_t eval_b_2;
  int priority;
  uv_thread_t task_id;
  int policy;
  sched_param param;
  
  task_id = 0xffffffffffffffea;
  iVar1 = uv_thread_getpriority(0,(int *)0x0);
  eval_b = (int64_t)iVar1;
  if (task_id == eval_b) {
    iVar1 = uv_sem_init(&sem,1);
    task_id = (uv_thread_t)iVar1;
    eval_b = 0;
    if (task_id == 0) {
      uv_sem_wait(&sem);
      iVar1 = uv_thread_create(&task_id,simple_task,(void *)0x0);
      uVar3 = (uv_thread_t)iVar1;
      eval_b_2 = 0;
      if (uVar3 == 0) {
        iVar1 = uv_thread_getpriority(task_id,&priority);
        uVar3 = (uv_thread_t)iVar1;
        eval_b_2 = 0;
        if (uVar3 == 0) {
          iVar1 = pthread_getschedparam(task_id,&policy,(sched_param *)&param);
          uVar3 = (uv_thread_t)iVar1;
          eval_b_2 = 0;
          if (uVar3 == 0) {
            iVar1 = sched_get_priority_min(policy);
            iVar2 = sched_get_priority_max(policy);
            if ((priority < iVar1) || (iVar2 < priority)) {
              fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-thread-priority.c"
                      ,0x4b,"priority >= min && priority <= max");
              abort();
            }
            iVar2 = uv_thread_setpriority(task_id,-2);
            uVar3 = (uv_thread_t)iVar2;
            eval_b_2 = 0;
            if (uVar3 == 0) {
              iVar2 = uv_thread_getpriority(task_id,&priority);
              uVar3 = (uv_thread_t)iVar2;
              eval_b_2 = 0;
              if (uVar3 == 0) {
                uVar3 = (uv_thread_t)priority;
                eval_b = (int64_t)iVar1;
                if (uVar3 == eval_b) {
                  tid = pthread_self();
                  iVar1 = uv_thread_getpriority(tid,&priority);
                  uVar3 = (uv_thread_t)iVar1;
                  eval_b_2 = 0;
                  if (uVar3 == 0) {
                    uVar3 = (uv_thread_t)priority;
                    eval_b_2 = 0;
                    if (uVar3 == 0) {
                      iVar1 = uv_thread_setpriority(tid,-2);
                      uVar3 = (uv_thread_t)iVar1;
                      eval_b_2 = 0;
                      if (uVar3 == 0) {
                        iVar1 = uv_thread_getpriority(tid,&priority);
                        uVar3 = (uv_thread_t)iVar1;
                        eval_b_2 = 0;
                        if (uVar3 == 0) {
                          uVar3 = (uv_thread_t)priority;
                          eval_b_2 = 4;
                          if (uVar3 == 4) {
                            uv_sem_post(&sem);
                            iVar1 = uv_thread_join(&task_id);
                            uVar3 = (uv_thread_t)iVar1;
                            eval_b_2 = 0;
                            if (uVar3 == 0) {
                              uv_sem_destroy(&sem);
                              return 0;
                            }
                            pcVar5 = "0";
                            pcVar4 = "uv_thread_join(&task_id)";
                            uVar6 = 100;
                            eval_b = eval_b_2;
                          }
                          else {
                            pcVar5 = "(0 - UV_THREAD_PRIORITY_LOWEST * 2)";
                            pcVar4 = "priority";
                            uVar6 = 0x5f;
                            eval_b = eval_b_2;
                          }
                        }
                        else {
                          pcVar5 = "0";
                          pcVar4 = "uv_thread_getpriority(pthread_self(), &priority)";
                          uVar6 = 0x5e;
                          eval_b = eval_b_2;
                        }
                      }
                      else {
                        pcVar5 = "0";
                        pcVar4 = "uv_thread_setpriority(pthread_self(), UV_THREAD_PRIORITY_LOWEST)";
                        uVar6 = 0x5d;
                        eval_b = eval_b_2;
                      }
                    }
                    else {
                      pcVar5 = "0";
                      pcVar4 = "priority";
                      uVar6 = 0x5c;
                      eval_b = eval_b_2;
                    }
                  }
                  else {
                    pcVar5 = "0";
                    pcVar4 = "uv_thread_getpriority(pthread_self(), &priority)";
                    uVar6 = 0x5b;
                    eval_b = eval_b_2;
                  }
                }
                else {
                  pcVar5 = "min";
                  pcVar4 = "priority";
                  uVar6 = 0x54;
                }
              }
              else {
                pcVar5 = "0";
                pcVar4 = "uv_thread_getpriority(task_id, &priority)";
                uVar6 = 0x4f;
                eval_b = eval_b_2;
              }
            }
            else {
              pcVar5 = "0";
              pcVar4 = "uv_thread_setpriority(task_id, UV_THREAD_PRIORITY_LOWEST)";
              uVar6 = 0x4e;
              eval_b = eval_b_2;
            }
          }
          else {
            pcVar5 = "0";
            pcVar4 = "pthread_getschedparam(task_id, &policy, &param)";
            uVar6 = 0x43;
            eval_b = eval_b_2;
          }
        }
        else {
          pcVar5 = "0";
          pcVar4 = "uv_thread_getpriority(task_id, &priority)";
          uVar6 = 0x3e;
          eval_b = eval_b_2;
        }
      }
      else {
        pcVar5 = "0";
        pcVar4 = "uv_thread_create(&task_id, simple_task, ((void*)0))";
        uVar6 = 0x3d;
        eval_b = eval_b_2;
      }
    }
    else {
      pcVar5 = "0";
      pcVar4 = "uv_sem_init(&sem, 1)";
      uVar6 = 0x3b;
      uVar3 = task_id;
    }
  }
  else {
    pcVar5 = "uv_thread_getpriority(0, ((void*)0))";
    pcVar4 = "UV_EINVAL";
    uVar6 = 0x3a;
    uVar3 = task_id;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-thread-priority.c"
          ,uVar6,pcVar4,"==",pcVar5,uVar3,"==",eval_b);
  abort();
}

Assistant:

TEST_IMPL(thread_priority) {
  int priority;
#ifndef _WIN32
  int min;
  int max;
  int policy;
  struct sched_param param;
#endif
  uv_thread_t task_id;

  /* Verify that passing a NULL pointer returns UV_EINVAL. */
  ASSERT_EQ(UV_EINVAL, uv_thread_getpriority(0, NULL));
  ASSERT_OK(uv_sem_init(&sem, 1));
  uv_sem_wait(&sem);
  ASSERT_OK(uv_thread_create(&task_id, simple_task, NULL));
  ASSERT_OK(uv_thread_getpriority(task_id, &priority));

#ifdef _WIN32
  ASSERT_EQ(priority, THREAD_PRIORITY_NORMAL);
#else
  ASSERT_OK(pthread_getschedparam(task_id, &policy, &param));
#ifdef __PASE__
  min = 1;
  max = 127;
#else
  min = sched_get_priority_min(policy);
  max = sched_get_priority_max(policy);
#endif
  ASSERT(priority >= min && priority <= max);
#endif

  ASSERT_OK(uv_thread_setpriority(task_id, UV_THREAD_PRIORITY_LOWEST));
  ASSERT_OK(uv_thread_getpriority(task_id, &priority));

#ifdef _WIN32
  ASSERT_EQ(priority, THREAD_PRIORITY_LOWEST);
#else
  ASSERT_EQ(priority, min);
#endif

/**
 * test set nice value for the calling thread with default schedule policy
*/
#ifdef __linux__
  ASSERT_OK(uv_thread_getpriority(pthread_self(), &priority));
  ASSERT_EQ(priority, 0);
  ASSERT_OK(uv_thread_setpriority(pthread_self(), UV_THREAD_PRIORITY_LOWEST));
  ASSERT_OK(uv_thread_getpriority(pthread_self(), &priority));
  ASSERT_EQ(priority, (0 - UV_THREAD_PRIORITY_LOWEST * 2));
#endif

  uv_sem_post(&sem);

  ASSERT_OK(uv_thread_join(&task_id));

  uv_sem_destroy(&sem);

  return 0;
}